

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLE.c
# Opt level: O0

int Sle_CutMergeOrder(int *pCut0,int *pCut1,int *pCut,int nLutSize)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  int iVar10;
  int *pC;
  int c;
  int *pC1;
  int k;
  int *pC0;
  int i;
  int nSize1;
  int nSize0;
  int nLutSize_local;
  int *pCut_local;
  int *pCut1_local;
  int *pCut0_local;
  
  iVar3 = Sle_CutSize(pCut0);
  iVar4 = Sle_CutSize(pCut1);
  piVar7 = Sle_CutLeaves(pCut0);
  piVar8 = Sle_CutLeaves(pCut1);
  piVar9 = Sle_CutLeaves(pCut);
  if ((iVar3 == nLutSize) && (iVar4 == nLutSize)) {
    for (pC0._0_4_ = 0; (int)pC0 < iVar3; pC0._0_4_ = (int)pC0 + 1) {
      if (piVar7[(int)pC0] != piVar8[(int)pC0]) {
        return 0;
      }
      piVar9[(int)pC0] = piVar7[(int)pC0];
    }
    uVar5 = Sle_CutSign(pCut0);
    uVar6 = Sle_CutSign(pCut1);
    iVar3 = Sle_CutSetSizeSign(nLutSize,uVar5 | uVar6);
    *pCut = iVar3;
    pCut0_local._4_4_ = 1;
  }
  else {
    pC._4_4_ = 0;
    pC1._4_4_ = 0;
    pC0._0_4_ = 0;
    iVar1 = pC._4_4_;
    iVar2 = pC1._4_4_;
    if (iVar3 == 0) {
LAB_009da8e2:
      pC1._4_4_ = iVar2;
      pC._4_4_ = iVar1;
      if (nLutSize + pC1._4_4_ < pC._4_4_ + iVar4) {
        pCut0_local._4_4_ = 0;
      }
      else {
        while (pC1._4_4_ < iVar4) {
          piVar9[pC._4_4_] = piVar8[pC1._4_4_];
          pC._4_4_ = pC._4_4_ + 1;
          pC1._4_4_ = pC1._4_4_ + 1;
        }
        uVar5 = Sle_CutSign(pCut0);
        uVar6 = Sle_CutSign(pCut1);
        iVar3 = Sle_CutSetSizeSign(pC._4_4_,uVar5 | uVar6);
        *pCut = iVar3;
        pCut0_local._4_4_ = 1;
      }
    }
    else if (iVar4 == 0) {
LAB_009da854:
      pC._4_4_ = iVar1;
      if (nLutSize + (int)pC0 < pC._4_4_ + iVar3) {
        pCut0_local._4_4_ = 0;
      }
      else {
        while ((int)pC0 < iVar3) {
          piVar9[pC._4_4_] = piVar7[(int)pC0];
          pC._4_4_ = pC._4_4_ + 1;
          pC0._0_4_ = (int)pC0 + 1;
        }
        uVar5 = Sle_CutSign(pCut0);
        uVar6 = Sle_CutSign(pCut1);
        iVar3 = Sle_CutSetSizeSign(pC._4_4_,uVar5 | uVar6);
        *pCut = iVar3;
        pCut0_local._4_4_ = 1;
      }
    }
    else {
      for (; pC._4_4_ != nLutSize; pC._4_4_ = pC._4_4_ + 1) {
        if (piVar7[(int)pC0] < piVar8[pC1._4_4_]) {
          iVar10 = (int)pC0 + 1;
          piVar9[pC._4_4_] = piVar7[(int)pC0];
          iVar1 = pC._4_4_ + 1;
          iVar2 = pC1._4_4_;
          pC0._0_4_ = iVar10;
          if (iVar3 <= iVar10) goto LAB_009da8e2;
        }
        else {
          if (piVar8[pC1._4_4_] < piVar7[(int)pC0]) {
            piVar9[pC._4_4_] = piVar8[pC1._4_4_];
          }
          else {
            iVar10 = (int)pC0 + 1;
            piVar9[pC._4_4_] = piVar7[(int)pC0];
            iVar1 = pC._4_4_ + 1;
            iVar2 = pC1._4_4_ + 1;
            pC0._0_4_ = iVar10;
            if (iVar3 <= iVar10) goto LAB_009da8e2;
          }
          iVar1 = pC._4_4_ + 1;
          if (iVar4 <= pC1._4_4_ + 1) goto LAB_009da854;
          pC1._4_4_ = pC1._4_4_ + 1;
        }
      }
      pCut0_local._4_4_ = 0;
    }
  }
  return pCut0_local._4_4_;
}

Assistant:

static inline int Sle_CutMergeOrder( int * pCut0, int * pCut1, int * pCut, int nLutSize )
{ 
    int nSize0   = Sle_CutSize(pCut0);
    int nSize1   = Sle_CutSize(pCut1);
    int i, * pC0 = Sle_CutLeaves(pCut0);
    int k, * pC1 = Sle_CutLeaves(pCut1);
    int c, * pC  = Sle_CutLeaves(pCut);
    // the case of the largest cut sizes
    if ( nSize0 == nLutSize && nSize1 == nLutSize )
    {
        for ( i = 0; i < nSize0; i++ )
        {
            if ( pC0[i] != pC1[i] )  return 0;
            pC[i] = pC0[i];
        }
        pCut[0] = Sle_CutSetSizeSign( nLutSize, Sle_CutSign(pCut0) | Sle_CutSign(pCut1) );
        return 1;
    }
    // compare two cuts with different numbers
    i = k = c = 0;
    if ( nSize0 == 0 ) goto FlushCut1;
    if ( nSize1 == 0 ) goto FlushCut0;
    while ( 1 )
    {
        if ( c == nLutSize ) return 0;
        if ( pC0[i] < pC1[k] )
        {
            pC[c++] = pC0[i++];
            if ( i >= nSize0 ) goto FlushCut1;
        }
        else if ( pC0[i] > pC1[k] )
        {
            pC[c++] = pC1[k++];
            if ( k >= nSize1 ) goto FlushCut0;
        }
        else
        {
            pC[c++] = pC0[i++]; k++;
            if ( i >= nSize0 ) goto FlushCut1;
            if ( k >= nSize1 ) goto FlushCut0;
        }
    }

FlushCut0:
    if ( c + nSize0 > nLutSize + i ) return 0;
    while ( i < nSize0 )
        pC[c++] = pC0[i++];
    pCut[0] = Sle_CutSetSizeSign( c, Sle_CutSign(pCut0) | Sle_CutSign(pCut1) );
    return 1;

FlushCut1:
    if ( c + nSize1 > nLutSize + k ) return 0;
    while ( k < nSize1 )
        pC[c++] = pC1[k++];
    pCut[0] = Sle_CutSetSizeSign( c, Sle_CutSign(pCut0) | Sle_CutSign(pCut1) );
    return 1;
}